

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractDOMParser.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::AbstractDOMParser::endAttList(AbstractDOMParser *this,DTDElementDecl *elemDecl)

{
  XMLBufferMgr *this_00;
  DOMDocumentImpl *pDVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  undefined4 extraout_var;
  XMLCh *pXVar6;
  long *plVar7;
  ulong uVar8;
  long *plVar9;
  XMLBuffer *this_01;
  XMLCh *pXVar10;
  undefined8 uVar11;
  long *plVar12;
  undefined4 extraout_var_03;
  long *plVar13;
  undefined4 extraout_var_04;
  long *plVar14;
  undefined1 *chars;
  ulong uVar15;
  XMLBufBid bbQName;
  XMLCh temp [1000];
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  
  bVar2 = DOMDocumentTypeImpl::isIntSubsetReading(this->fDocumentType);
  if (bVar2) {
    XMLBuffer::append(this->fInternalSubset,L'>');
  }
  iVar4 = (*(elemDecl->super_XMLElementDecl).super_XSerializable._vptr_XSerializable[7])(elemDecl);
  if ((char)iVar4 != '\0') {
    iVar4 = (*(elemDecl->super_XMLElementDecl).super_XSerializable._vptr_XSerializable[5])(elemDecl)
    ;
    plVar14 = (long *)CONCAT44(extraout_var,iVar4);
    pDVar1 = this->fDocument;
    pXVar6 = XMLElementDecl::getFullName(&elemDecl->super_XMLElementDecl);
    iVar4 = (*(pDVar1->super_DOMMemoryManager)._vptr_DOMMemoryManager[0x38])(pDVar1,pXVar6);
    plVar7 = (long *)CONCAT44(extraout_var_00,iVar4);
    bVar2 = this->fScanner->fDoNamespaces;
    this_00 = &this->fBufMgr;
    for (uVar15 = 0; uVar8 = (**(code **)(*plVar14 + 0x50))(plVar14), uVar15 < uVar8;
        uVar15 = uVar15 + 1) {
      plVar9 = (long *)(**(code **)(*plVar14 + 0x58))(plVar14,uVar15);
      if (plVar9[4] != 0) {
        if (bVar2 == false) {
          pDVar1 = this->fDocument;
          uVar11 = (**(code **)(*plVar9 + 0x28))(plVar9);
          iVar4 = (*(pDVar1->super_DOMMemoryManager)._vptr_DOMMemoryManager[0x32])(pDVar1,uVar11);
          plVar12 = (long *)CONCAT44(extraout_var_02,iVar4);
          plVar13 = (long *)(**(code **)(*plVar7 + 0x168))(plVar7,plVar12);
          if (plVar13 != (long *)0x0) {
            (**(code **)(*plVar13 + 0x138))(plVar13);
          }
        }
        else {
          pXVar6 = (XMLCh *)(**(code **)(*plVar9 + 0x28))(plVar9);
          uVar5 = DOMDocumentImpl::indexofQualifiedName(pXVar6);
          this_01 = XMLBufferMgr::bidOnBuffer(this_00);
          bbQName.fBuffer = this_01;
          bbQName.fMgr = this_00;
          if ((int)uVar5 < 1) {
            bVar3 = XMLString::equals(pXVar6,L"xmlns");
            if (bVar3) {
              XMLBuffer::append(this_01,(XMLCh *)XMLUni::fgXMLNSURIName);
            }
          }
          else {
            pXVar10 = temp;
            if (999 < uVar5) {
              iVar4 = (*this->fMemoryManager->_vptr_MemoryManager[3])
                                (this->fMemoryManager,(ulong)(uVar5 * 2 + 2));
              pXVar10 = (XMLCh *)CONCAT44(extraout_var_01,iVar4);
            }
            XMLString::subString(pXVar10,pXVar6,0,(ulong)uVar5,this->fMemoryManager);
            bVar3 = XMLString::equals(pXVar10,L"xmlns");
            chars = XMLUni::fgXMLURIName;
            if (bVar3) {
              chars = XMLUni::fgXMLNSURIName;
            }
            XMLBuffer::append(this_01,(XMLCh *)chars);
            if (999 < uVar5) {
              (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,pXVar10);
            }
          }
          pDVar1 = this->fDocument;
          pXVar10 = this_01->fBuffer;
          pXVar10[this_01->fIndex] = L'\0';
          iVar4 = (*(pDVar1->super_DOMMemoryManager)._vptr_DOMMemoryManager[0x53])
                            (pDVar1,pXVar10,pXVar6);
          plVar12 = (long *)CONCAT44(extraout_var_03,iVar4);
          plVar13 = (long *)(**(code **)(*plVar7 + 0x1a0))(plVar7,plVar12);
          if (plVar13 != (long *)0x0) {
            (**(code **)(*plVar13 + 0x138))(plVar13);
          }
          XMLBufBid::~XMLBufBid(&bbQName);
        }
        (**(code **)(*plVar12 + 0x1c0))(plVar12,plVar9[4]);
        (**(code **)(*plVar12 + 0x198))(plVar12,0);
      }
    }
    iVar4 = (*(this->fDocumentType->super_DOMDocumentType).super_DOMNode._vptr_DOMNode[0x38])();
    plVar14 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_04,iVar4) + 0x10))
                                ((long *)CONCAT44(extraout_var_04,iVar4),plVar7);
    if (plVar14 != (long *)0x0) {
      (**(code **)(*plVar14 + 0x138))(plVar14);
    }
  }
  return;
}

Assistant:

void AbstractDOMParser::endAttList
(
    const   DTDElementDecl& elemDecl
)
{
    if (fDocumentType->isIntSubsetReading())
    {
        //print the closing angle
        fInternalSubset.append(chCloseAngle);
    }

	// this section sets up default attributes.
	// default attribute nodes are stored in a NamedNodeMap DocumentTypeImpl::elements
	// default attribute data attached to the document is used to conform to the
	// DOM spec regarding creating element nodes & removing attributes with default values
	// see DocumentTypeImpl
	if (elemDecl.hasAttDefs())
	{
        XMLAttDefList* defAttrs = &elemDecl.getAttDefList();
        XMLAttDef* attr = 0;

        DOMAttrImpl * insertAttr = 0;
        DOMElement     *elem  = fDocument->createElement(elemDecl.getFullName());
        DOMElementImpl *elemImpl = (DOMElementImpl *) elem;
        bool doNamespaces = fScanner->getDoNamespaces();

        for(XMLSize_t i=0; i<defAttrs->getAttDefCount(); i++)
        {
            attr = &defAttrs->getAttDef(i);
            if (attr->getValue() != 0)
            {
                if (doNamespaces)
                {
                    // DOM Level 2 wants all namespace declaration attributes
                    // to be bound to "http://www.w3.org/2000/xmlns/"
                    // So as long as the XML parser doesn't do it, it needs to
                    // done here.
                    const XMLCh* qualifiedName = attr->getFullName();
                    int index = DOMDocumentImpl::indexofQualifiedName(qualifiedName);

                    XMLBufBid bbQName(&fBufMgr);
                    XMLBuffer& buf = bbQName.getBuffer();
                    static const XMLCh XMLNS[] = {
                        chLatin_x, chLatin_m, chLatin_l, chLatin_n, chLatin_s, chNull};

                    if (index > 0) {
                        // there is prefix
                        // map to XML URI for all cases except when prefix == "xmlns"
                        XMLCh* prefix;
                        XMLCh temp[1000];

                        if (index > 999)
                            prefix = (XMLCh*) fMemoryManager->allocate
                            (
                                (index + 1) * sizeof(XMLCh)
                            );//new XMLCh[index+1];
                        else
                            prefix = temp;

                        XMLString::subString(prefix ,qualifiedName, 0, index, fMemoryManager);

                        if (XMLString::equals(prefix,XMLNS))
                            buf.append(XMLUni::fgXMLNSURIName);
                        else
                            buf.append(XMLUni::fgXMLURIName);

                        if (index > 999)
                            fMemoryManager->deallocate(prefix);//delete [] prefix;
                    }
                    else {
                        //   No prefix
                        if (XMLString::equals(qualifiedName,XMLNS))
                            buf.append(XMLUni::fgXMLNSURIName);
                    }

                    insertAttr = (DOMAttrImpl *) fDocument->createAttributeNS(
                       buf.getRawBuffer(),     // NameSpaceURI
                       qualifiedName);   // qualified name

                    DOMNode* remAttr = elemImpl->setAttributeNodeNS(insertAttr);
                    if (remAttr)
                        remAttr->release();
                }
                else
                {
                    // Namespaces is turned off...
                    insertAttr = (DOMAttrImpl *) fDocument->createAttribute(attr->getFullName());
                    DOMNode* remAttr = elemImpl->setAttributeNode(insertAttr);
                    if (remAttr)
                        remAttr->release();
                }

                insertAttr->setValueFast(attr->getValue());
                insertAttr->setSpecified(false);
            }
        }
        DOMNode* rem = fDocumentType->getElements()->setNamedItem(elemImpl);
        if (rem)
            rem->release();
    }
}